

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_cookie.cpp
# Opt level: O0

cookie * __thiscall cppcms::http::cookie::operator=(cookie *this,cookie *other)

{
  copy_ptr<cppcms::http::cookie::_data> *in_RSI;
  cookie *in_RDI;
  
  booster::copy_ptr<cppcms::http::cookie::_data>::operator=(in_RSI,&in_RDI->d);
  std::__cxx11::string::operator=((string *)&in_RDI->name_,(string *)(in_RSI + 1));
  std::__cxx11::string::operator=((string *)&in_RDI->value_,(string *)(in_RSI + 5));
  std::__cxx11::string::operator=((string *)&in_RDI->path_,(string *)(in_RSI + 9));
  std::__cxx11::string::operator=((string *)&in_RDI->domain_,(string *)(in_RSI + 0xd));
  std::__cxx11::string::operator=((string *)&in_RDI->comment_,(string *)(in_RSI + 0x11));
  in_RDI->max_age_ = *(uint *)&in_RSI[0x15].ptr_;
  in_RDI->expires_ = (time_t)in_RSI[0x16].ptr_;
  *(uint *)&in_RDI->field_0xb8 =
       *(uint *)&in_RDI->field_0xb8 & 0xfffffffe | *(uint *)&in_RSI[0x17].ptr_ & 1;
  *(uint *)&in_RDI->field_0xb8 =
       *(uint *)&in_RDI->field_0xb8 & 0xfffffffd | (*(uint *)&in_RSI[0x17].ptr_ >> 1 & 1) << 1;
  *(uint *)&in_RDI->field_0xb8 =
       *(uint *)&in_RDI->field_0xb8 & 0xfffffffb | (*(uint *)&in_RSI[0x17].ptr_ >> 2 & 1) << 2;
  *(uint *)&in_RDI->field_0xb8 =
       *(uint *)&in_RDI->field_0xb8 & 0xfffffff7 | (*(uint *)&in_RSI[0x17].ptr_ >> 3 & 1) << 3;
  *(uint *)&in_RDI->field_0xb8 =
       *(uint *)&in_RDI->field_0xb8 & 0xffffffef | (*(uint *)&in_RSI[0x17].ptr_ >> 4 & 1) << 4;
  *(uint *)&in_RDI->field_0xb8 =
       *(uint *)&in_RDI->field_0xb8 & 0xffffffdf | (*(uint *)&in_RSI[0x17].ptr_ >> 5 & 1) << 5;
  *(uint *)&in_RDI->field_0xb8 =
       *(uint *)&in_RDI->field_0xb8 & 0xffffffbf | (*(uint *)&in_RSI[0x17].ptr_ >> 6 & 1) << 6;
  return in_RDI;
}

Assistant:

cookie &cookie::operator=(cookie &&other)
{
	d=std::move(other.d);
	name_=std::move(other.name_);
	value_=std::move(other.value_);
	path_=std::move(other.path_);
	domain_=std::move(other.domain_);
	comment_=std::move(other.comment_);
	max_age_=other.max_age_;
	expires_=other.expires_;
	secure_=other.secure_;
	has_age_=other.has_age_;
	has_expiration_ = other.has_expiration_;
	httponly_ = other.httponly_;
	samesite_none_ = other.samesite_none_;
	samesite_lax_ = other.samesite_lax_;
	samesite_strict_ = other.samesite_strict_;
	return *this;
}